

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticModelTester.cpp
# Opt level: O2

void __thiscall psy::C::SemanticModelTester::case0002(SemanticModelTester *this)

{
  DeclarationCategory DVar1;
  SymbolKind SVar2;
  bool bVar3;
  TypeKind TVar4;
  BasicTypeKind BVar5;
  int iVar6;
  DeclaratorSyntax *node;
  Symbol *this_00;
  undefined4 extraout_var;
  Lexeme *pLVar7;
  Type *pTVar8;
  undefined4 extraout_var_00;
  ostream *poVar9;
  undefined4 extraout_var_01;
  ostream *this_02;
  undefined8 uVar10;
  allocator<char> local_6a;
  allocator<char> local_69;
  string local_68;
  undefined1 local_48 [48];
  ObjectDeclarationSymbol *this_01;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"int ( x ) ;",&local_69);
  std::__cxx11::string::string<std::allocator<char>>((string *)(local_48 + 0x10),"",&local_6a);
  compile<psy::C::VariableAndOrFunctionDeclarationSyntax>
            ((SemanticModelTester *)local_48,(string *)this,&local_68);
  std::__cxx11::string::~string((string *)(local_48 + 0x10));
  std::__cxx11::string::~string((string *)&local_68);
  node = (DeclaratorSyntax *)
         (**(code **)(*(long *)((TestSuite *)(local_48._8_8_ + 0x30))->_vptr_TestSuite[1] + 0x2a0))
                   ();
  this_00 = &SemanticModel::declarationBy((SemanticModel *)local_48._0_8_,node)->super_Symbol;
  if (this_00 == (Symbol *)0x0) {
    poVar9 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar9 = std::operator<<(poVar9,"\t\tExpression is NOT ");
    poVar9 = std::operator<<(poVar9,"true");
    poVar9 = std::operator<<(poVar9,"\n");
    poVar9 = std::operator<<(poVar9,"\t\t");
    poVar9 = std::operator<<(poVar9,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    this_02 = (ostream *)std::operator<<(poVar9,":");
    iVar6 = 0x75;
  }
  else {
    DVar1 = DeclarationSymbol::category((DeclarationSymbol *)this_00);
    if (DVar1 == Object) {
      SVar2 = Symbol::kind(this_00);
      if (SVar2 == VariableDeclaration) {
        iVar6 = (*this_00->_vptr_Symbol[0xd])(this_00);
        this_01 = (ObjectDeclarationSymbol *)CONCAT44(extraout_var,iVar6);
        pLVar7 = &ObjectDeclarationSymbol::name(this_01)->super_Lexeme;
        Lexeme::valueText_abi_cxx11_(&local_68,pLVar7);
        bVar3 = std::operator==(&local_68,"x");
        std::__cxx11::string::~string((string *)&local_68);
        if (!bVar3) {
          poVar9 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
          poVar9 = std::operator<<(poVar9,"\t\tActual  : ");
          pLVar7 = &ObjectDeclarationSymbol::name(this_01)->super_Lexeme;
          Lexeme::valueText_abi_cxx11_(&local_68,pLVar7);
          poVar9 = std::operator<<(poVar9,(string *)&local_68);
          poVar9 = std::operator<<(poVar9,"\n");
          poVar9 = std::operator<<(poVar9,"\t\tExpected: ");
          poVar9 = std::operator<<(poVar9,"x");
          poVar9 = std::operator<<(poVar9,"\n");
          poVar9 = std::operator<<(poVar9,"\t\t");
          poVar9 = std::operator<<(poVar9,
                                   "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                                  );
          poVar9 = std::operator<<(poVar9,":");
          poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,0x79);
          std::endl<char,std::char_traits<char>>(poVar9);
          std::__cxx11::string::~string((string *)&local_68);
          goto LAB_00386243;
        }
        pTVar8 = ObjectDeclarationSymbol::type(this_01);
        TVar4 = Type::kind(pTVar8);
        if (TVar4 == Basic) {
          pTVar8 = ObjectDeclarationSymbol::type(this_01);
          iVar6 = (*pTVar8->_vptr_Type[5])(pTVar8);
          BVar5 = BasicType::kind((BasicType *)CONCAT44(extraout_var_00,iVar6));
          if (BVar5 == Int_S) {
            return;
          }
          poVar9 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
          poVar9 = std::operator<<(poVar9,"\t\tActual  : ");
          pTVar8 = ObjectDeclarationSymbol::type(this_01);
          iVar6 = (*pTVar8->_vptr_Type[5])(pTVar8);
          BVar5 = BasicType::kind((BasicType *)CONCAT44(extraout_var_01,iVar6));
          poVar9 = C::operator<<(poVar9,BVar5);
          poVar9 = std::operator<<(poVar9,"\n");
          poVar9 = std::operator<<(poVar9,"\t\tExpected: ");
          poVar9 = C::operator<<(poVar9,Int_S);
          poVar9 = std::operator<<(poVar9,"\n");
          poVar9 = std::operator<<(poVar9,"\t\t");
          poVar9 = std::operator<<(poVar9,
                                   "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                                  );
          this_02 = (ostream *)std::operator<<(poVar9,":");
          iVar6 = 0x7b;
        }
        else {
          poVar9 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
          poVar9 = std::operator<<(poVar9,"\t\tActual  : ");
          pTVar8 = ObjectDeclarationSymbol::type(this_01);
          TVar4 = Type::kind(pTVar8);
          poVar9 = ::operator<<(poVar9,TVar4);
          poVar9 = std::operator<<(poVar9,"\n");
          poVar9 = std::operator<<(poVar9,"\t\tExpected: ");
          poVar9 = ::operator<<(poVar9,Basic);
          poVar9 = std::operator<<(poVar9,"\n");
          poVar9 = std::operator<<(poVar9,"\t\t");
          poVar9 = std::operator<<(poVar9,
                                   "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                                  );
          this_02 = (ostream *)std::operator<<(poVar9,":");
          iVar6 = 0x7a;
        }
      }
      else {
        poVar9 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
        poVar9 = std::operator<<(poVar9,"\t\tActual  : ");
        SVar2 = Symbol::kind(this_00);
        poVar9 = C::operator<<(poVar9,SVar2);
        poVar9 = std::operator<<(poVar9,"\n");
        poVar9 = std::operator<<(poVar9,"\t\tExpected: ");
        poVar9 = C::operator<<(poVar9,VariableDeclaration);
        poVar9 = std::operator<<(poVar9,"\n");
        poVar9 = std::operator<<(poVar9,"\t\t");
        poVar9 = std::operator<<(poVar9,
                                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                                );
        this_02 = (ostream *)std::operator<<(poVar9,":");
        iVar6 = 0x77;
      }
    }
    else {
      poVar9 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
      poVar9 = std::operator<<(poVar9,"\t\tActual  : ");
      DVar1 = DeclarationSymbol::category((DeclarationSymbol *)this_00);
      poVar9 = C::operator<<(poVar9,DVar1);
      poVar9 = std::operator<<(poVar9,"\n");
      poVar9 = std::operator<<(poVar9,"\t\tExpected: ");
      poVar9 = C::operator<<(poVar9,Object);
      poVar9 = std::operator<<(poVar9,"\n");
      poVar9 = std::operator<<(poVar9,"\t\t");
      poVar9 = std::operator<<(poVar9,
                               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                              );
      this_02 = (ostream *)std::operator<<(poVar9,":");
      iVar6 = 0x76;
    }
  }
  poVar9 = (ostream *)std::ostream::operator<<(this_02,iVar6);
  std::endl<char,std::char_traits<char>>(poVar9);
LAB_00386243:
  uVar10 = __cxa_allocate_exception(1);
  __cxa_throw(uVar10,&TestFailed::typeinfo,0);
}

Assistant:

void SemanticModelTester::case0002()
{
    auto [varAndOrFunDeclNode, semaModel] =
            compile<VariableAndOrFunctionDeclarationSyntax>("int ( x ) ;");

    auto decltor = varAndOrFunDeclNode->declarators()->value;
    auto parenDecltor = decltor->asParenthesizedDeclarator();
    const DeclarationSymbol* declSym = semaModel->declarationBy(parenDecltor);
    PSY_EXPECT_TRUE(declSym);
    PSY_EXPECT_EQ_ENU(declSym->category(), DeclarationCategory::Object, DeclarationCategory);
    PSY_EXPECT_EQ_ENU(declSym->kind(), SymbolKind::VariableDeclaration, SymbolKind);
    const VariableDeclarationSymbol* varDeclSym = declSym->asVariableDeclaration();
    PSY_EXPECT_EQ_STR(varDeclSym->name()->valueText(), "x");
    PSY_EXPECT_EQ_ENU(varDeclSym->type()->kind(), TypeKind::Basic, TypeKind);
    PSY_EXPECT_EQ_ENU(varDeclSym->type()->asBasicType()->kind(), BasicTypeKind::Int_S, BasicTypeKind);
}